

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O3

vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> * __thiscall
dg::vr::RelationsAnalyzer::getBranchChangeLocations
          (vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
           *__return_storage_ptr__,RelationsAnalyzer *this,VRLocation *join,
          VectorSet<const_llvm::Value_*> *froms)

{
  pointer ppVVar1;
  pointer ppVVar2;
  HandlePtr pBVar3;
  ulong uVar4;
  pointer ppVVar5;
  VectorSet<const_llvm::Value_*> *__range3;
  VRLocation *loc;
  VRLocation *local_50;
  undefined8 local_48;
  iterator iStack_40;
  pointer local_38;
  
  local_48._0_4_ = 0;
  local_48._4_4_ = 0;
  iStack_40._M_current._0_4_ = 0;
  iStack_40._M_current._4_4_ = 0;
  local_48 = (void *)0x0;
  iStack_40._M_current = (VRLocation **)0x0;
  local_38 = (pointer)0x0;
  ppVVar2 = (join->predecessors).
            super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((int)((ulong)((long)(join->predecessors).
                          super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar2) >> 3) == 0) {
    local_38 = (pointer)0x0;
  }
  else {
    uVar4 = 0;
    do {
      local_50 = ppVVar2[uVar4]->source;
      ppVVar5 = (froms->vec).
                super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      ppVVar1 = (froms->vec).
                super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        if (ppVVar5 == ppVVar1) {
          (__return_storage_ptr__->
          super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
          )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (__return_storage_ptr__->
          super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          if (local_48 == (void *)0x0) {
            return __return_storage_ptr__;
          }
          operator_delete(local_48,(long)local_38 - (long)local_48);
          return __return_storage_ptr__;
        }
        pBVar3 = ValueRelations::maybeGet(&local_50->relations,*ppVVar5);
        if ((pBVar3 != (HandlePtr)0x0) &&
           ((pBVar3->relatedBuckets)._M_elems[10].vec.
            super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pBVar3->relatedBuckets)._M_elems[10].vec.
            super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) break;
        ppVVar5 = ppVVar5 + 1;
      }
      if (iStack_40._M_current == local_38) {
        std::vector<dg::vr::VRLocation_const*,std::allocator<dg::vr::VRLocation_const*>>::
        _M_realloc_insert<dg::vr::VRLocation*&>
                  ((vector<dg::vr::VRLocation_const*,std::allocator<dg::vr::VRLocation_const*>> *)
                   &local_48,iStack_40,&local_50);
      }
      else {
        *iStack_40._M_current = local_50;
        iStack_40._M_current = iStack_40._M_current + 1;
      }
      uVar4 = uVar4 + 1;
      ppVVar2 = (join->predecessors).
                super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar4 < ((ulong)((long)(join->predecessors).
                                    super__Vector_base<dg::vr::VREdge_*,_std::allocator<dg::vr::VREdge_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar2) >> 3
                     & 0xffffffff));
  }
  *(undefined4 *)
   &(__return_storage_ptr__->
    super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>).
    _M_impl.super__Vector_impl_data._M_start = (undefined4)local_48;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
           )._M_impl.super__Vector_impl_data._M_start + 4) = local_48._4_4_;
  *(undefined4 *)
   &(__return_storage_ptr__->
    super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>).
    _M_impl.super__Vector_impl_data._M_finish = iStack_40._M_current._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->
           super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
           )._M_impl.super__Vector_impl_data._M_finish + 4) = iStack_40._M_current._4_4_;
  (__return_storage_ptr__->
  super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_38;
  return __return_storage_ptr__;
}

Assistant:

std::vector<const VRLocation *>
RelationsAnalyzer::getBranchChangeLocations(const VRLocation &join,
                                            const VectorSet<V> &froms) const {
    std::vector<const VRLocation *> changeLocations;
    for (unsigned i = 0; i < join.predsSize(); ++i) {
        auto loc = join.getPredLocation(i);
        bool hasLoad = false;
        for (V from : froms) {
            if (loc->relations.hasLoad(from)) {
                hasLoad = true;
                break;
            }
        }
        if (!hasLoad)
            return {};
        changeLocations.emplace_back(loc);
    }
    return changeLocations;
}